

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::DoubleRange::MergeFrom(DoubleRange *this,DoubleRange *from)

{
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O2/mlmodel/format/DataStructures.pb.cc"
               ,0x986);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  if (from->minvalue_ != 0.0) {
    this->minvalue_ = from->minvalue_;
  }
  if (from->maxvalue_ != 0.0) {
    this->maxvalue_ = from->maxvalue_;
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void DoubleRange::MergeFrom(const DoubleRange& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.DoubleRange)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_minvalue = from._internal_minvalue();
  uint64_t raw_minvalue;
  memcpy(&raw_minvalue, &tmp_minvalue, sizeof(tmp_minvalue));
  if (raw_minvalue != 0) {
    _internal_set_minvalue(from._internal_minvalue());
  }
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_maxvalue = from._internal_maxvalue();
  uint64_t raw_maxvalue;
  memcpy(&raw_maxvalue, &tmp_maxvalue, sizeof(tmp_maxvalue));
  if (raw_maxvalue != 0) {
    _internal_set_maxvalue(from._internal_maxvalue());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}